

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

int stb_ischar(char c,char *set)

{
  byte bVar1;
  char **ppcVar2;
  uint uVar3;
  int iVar4;
  uchar (*__s) [256];
  long lVar5;
  int iVar6;
  long lVar7;
  size_t __size;
  
  uVar3 = stb_perfect_hash(&stb_ischar::p,(uint)set);
  if ((int)uVar3 < 0) {
    if (set == (char *)0x0) {
      stb_arr_free_(&stb_ischar::sets);
      free(stb_ischar::tables);
      stb_ischar::tables = (uchar (*) [256])0x0;
      stb_perfect_destroy(&stb_ischar::p);
      uVar3 = 0xffffffff;
    }
    else {
      if (stb_ischar::sets == (char **)0x0) {
        iVar6 = 1;
        iVar4 = 0;
      }
      else {
        iVar6 = *(int *)(stb_ischar::sets + -2) + 1;
        iVar4 = *(int *)((long)stb_ischar::sets + -0xc);
      }
      if (iVar4 < iVar6) {
        stb__arr_addlen_(&stb_ischar::sets,8,1);
      }
      else {
        *(int *)(stb_ischar::sets + -2) = *(int *)(stb_ischar::sets + -2) + 1;
      }
      iVar4 = 0;
      if (stb_ischar::sets == (char **)0x0) {
        lVar7 = 0;
      }
      else {
        lVar7 = (long)*(int *)(stb_ischar::sets + -2);
      }
      stb_ischar::sets[lVar7 + -1] = set;
      stb_perfect_destroy(&stb_ischar::p);
      if (stb_ischar::sets != (char **)0x0) {
        iVar4 = *(int *)(stb_ischar::sets + -2);
      }
      iVar4 = stb_perfect_create(&stb_ischar::p,(uint *)stb_ischar::sets,iVar4);
      if (iVar4 == 0) {
        __assert_fail("n != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                      ,0xea6,"int stb_ischar(char, char *)");
      }
      __size = (long)(iVar4 + 7 >> 3) << 8;
      __s = (uchar (*) [256])realloc(stb_ischar::tables,__size);
      lVar7 = 0;
      stb_ischar::tables = __s;
      memset(__s,0,__size);
      ppcVar2 = stb_ischar::sets;
      while( true ) {
        if (ppcVar2 == (char **)0x0) {
          lVar5 = 0;
        }
        else {
          lVar5 = (long)*(int *)(ppcVar2 + -2);
        }
        if (lVar5 <= lVar7) break;
        uVar3 = stb_perfect_hash(&stb_ischar::p,*(uint *)(ppcVar2 + lVar7));
        if ((int)uVar3 < 0) {
          __assert_fail("k >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0xeac,"int stb_ischar(char, char *)");
        }
        bVar1 = stb_ischar::bit[uVar3 & 7];
        for (lVar5 = 0; (lVar5 == 0 || (ppcVar2[lVar7][lVar5] != '\0')); lVar5 = lVar5 + 1) {
          __s[uVar3 >> 3][(byte)ppcVar2[lVar7][lVar5]] =
               __s[uVar3 >> 3][(byte)ppcVar2[lVar7][lVar5]] | bVar1;
        }
        lVar7 = lVar7 + 1;
      }
      uVar3 = stb_perfect_hash(&stb_ischar::p,(uint)set);
    }
    if (set == (char *)0x0) {
      return 0;
    }
  }
  return (uint)(stb_ischar::bit[uVar3 & 7] & stb_ischar::tables[(int)uVar3 >> 3][(byte)c]);
}

Assistant:

int stb_ischar(char c, char *set)
{
   static unsigned char bit[8] = { 1,2,4,8,16,32,64,128 };
   static stb_perfect p;
   static unsigned char (*tables)[256];
   static char ** sets = NULL;

   int z = stb_perfect_hash(&p, (int) set);
   if (z < 0) {
      int i,k,n,j,f;
      // special code that means free all existing data
      if (set == NULL) {
         stb_arr_free(sets);
         free(tables);
         tables = NULL;
         stb_perfect_destroy(&p);
         return 0;
      }
      stb_arr_push(sets, set);
      stb_perfect_destroy(&p);
      n = stb_perfect_create(&p, (unsigned int *) (char **) sets, stb_arr_len(sets));
      assert(n != 0);
      k = (n+7) >> 3;
      tables = (unsigned char (*)[256]) realloc(tables, sizeof(*tables) * k);
      memset(tables, 0, sizeof(*tables) * k);
      for (i=0; i < stb_arr_len(sets); ++i) {
         k = stb_perfect_hash(&p, (int) sets[i]);
         assert(k >= 0);
         n = k >> 3;
         f = bit[k&7];
         for (j=0; !j || sets[i][j]; ++j) {
            tables[n][(unsigned char) sets[i][j]] |= f;
         }
      }
      z = stb_perfect_hash(&p, (int) set);
   }
   return tables[z >> 3][(unsigned char) c] & bit[z & 7];
}